

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O3

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::SetNotNullInfo::Copy(SetNotNullInfo *this)

{
  AlterInfo *in_RSI;
  AlterEntryData local_80;
  
  AlterInfo::GetAlterEntryData(&local_80,in_RSI);
  make_uniq_base<duckdb::AlterInfo,duckdb::SetNotNullInfo,duckdb::AlterEntryData,std::__cxx11::string_const&>
            ((duckdb *)this,&local_80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 1));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.name._M_dataplus._M_p != &local_80.name.field_2) {
    operator_delete(local_80.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.schema._M_dataplus._M_p != &local_80.schema.field_2) {
    operator_delete(local_80.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.catalog._M_dataplus._M_p != &local_80.catalog.field_2) {
    operator_delete(local_80.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> SetNotNullInfo::Copy() const {
	return make_uniq_base<AlterInfo, SetNotNullInfo>(GetAlterEntryData(), column_name);
}